

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::~Array
          (Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *this)

{
  Branch *pBVar1;
  size_t sVar2;
  
  pBVar1 = this->ptr;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Branch *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pBVar1,0x58,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::_::ArrayJoinPromiseNodeBase::Branch>::destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }